

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.h
# Opt level: O0

void __thiscall
TPZBlockDiagonal<double>::CopyFrom(TPZBlockDiagonal<double> *this,TPZMatrix<double> *mat)

{
  TPZBlockDiagonal<double> *this_00;
  long in_RSI;
  TPZBlockDiagonal<double> *from;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZBlockDiagonal<double> *in_stack_ffffffffffffffc8;
  
  if (in_RSI == 0) {
    this_00 = (TPZBlockDiagonal<double> *)0x0;
  }
  else {
    this_00 = (TPZBlockDiagonal<double> *)
              __dynamic_cast(in_RSI,&TPZMatrix<double>::typeinfo,&typeinfo,0);
  }
  if (this_00 == (TPZBlockDiagonal<double> *)0x0) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZBlockDiagonal<double>::CopyFrom(const TPZMatrix<TVar> *) [TVar = double]"
                   );
    std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
    std::operator<<((ostream *)&std::cerr,"Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  else {
    operator=(this_00,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZBlockDiagonal<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }